

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O0

ssize_t __thiscall
ddd::DaTrie<false,_true,_false>::write
          (DaTrie<false,_true,_false> *this,int __fd,void *__buf,size_t __n)

{
  ssize_t extraout_RAX;
  uint in_register_00000034;
  vector<char,_std::allocator<char>_> *unaff_retaddr;
  DaTrie<false,_true,_false> *os;
  
  os = this;
  utils::write_vector<ddd::Bc>
            ((vector<ddd::Bc,_std::allocator<ddd::Bc>_> *)unaff_retaddr,(ostream *)this);
  utils::write_vector<char>(unaff_retaddr,(ostream *)os);
  utils::write_vector<ddd::Block>
            ((vector<ddd::Block,_std::allocator<ddd::Block>_> *)unaff_retaddr,(ostream *)os);
  utils::write_vector<ddd::NodeLink>
            ((vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_> *)unaff_retaddr,(ostream *)os);
  utils::write_value<unsigned_int>(in_register_00000034,(ostream *)this);
  utils::write_value<unsigned_int>(in_register_00000034,(ostream *)this);
  utils::write_value<unsigned_int>(in_register_00000034,(ostream *)this);
  return extraout_RAX;
}

Assistant:

void write(std::ostream& os) const {
    utils::write_vector(bc_, os);
    utils::write_vector(tail_, os);
    utils::write_vector(blocks_, os);
    utils::write_vector(node_links_, os);
    utils::write_value(head_pos_, os);
    utils::write_value(bc_emps_, os);
    utils::write_value(tail_emps_, os);
  }